

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O2

void cleanup(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ulong uVar2;
  uv_thread_t *tid;
  long lVar3;
  
  if (initialized != 0) {
    post(&exit_message);
    uVar2 = 0xffffffffffffffff;
    lVar3 = 0;
    while( true ) {
      uVar2 = uVar2 + 1;
      if (nthreads <= uVar2) break;
      tid = (uv_thread_t *)((long)threads + lVar3);
      lVar3 = lVar3 + 8;
      iVar1 = uv_thread_join(tid);
      if (iVar1 != 0) {
        abort();
      }
    }
    if (threads != default_threads) {
      uv__free(threads);
    }
    uv_mutex_destroy(&mutex);
    uv_cond_destroy(&cond);
    threads = (uv_thread_t *)0x0;
    nthreads = 0;
    initialized = 0;
  }
  return;
}

Assistant:

static void
cleanup(void *data)
{
	struct name_cache *cache = (struct name_cache *)data;
	size_t i;

	if (cache != NULL) {
		for (i = 0; i < cache->size; i++) {
			if (cache->cache[i].name != NULL &&
			    cache->cache[i].name != NO_NAME)
				free((void *)(uintptr_t)cache->cache[i].name);
		}
		free(cache->buff);
		free(cache);
	}
}